

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_> __thiscall
node::anon_unknown_2::ChainImpl::handleNotifications
          (ChainImpl *this,shared_ptr<interfaces::Chain::Notifications> notifications)

{
  _func_int **pp_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ValidationSignals *pVVar3;
  _func_int **pp_Var4;
  _func_int *p_Var5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  long in_FS_OFFSET;
  shared_ptr<CValidationInterface> callbacks;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_70 [2];
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<node::(anonymous_namespace)::NotificationsProxy,_std::allocator<node::(anonymous_namespace)::NotificationsProxy>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_60;
  __allocator_type __a2;
  shared_ptr<CValidationInterface> local_48;
  long local_38;
  
  _Var6 = notifications.
          super___shared_ptr<interfaces::Chain::Notifications,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pVVar3 = validation_signals((ChainImpl *)
                              notifications.
                              super___shared_ptr<interfaces::Chain::Notifications,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
  pp_Var4 = (_func_int **)operator_new(0x20);
  pp_Var1 = (_Var6._M_pi)->_vptr__Sp_counted_base;
  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(_Var6._M_pi)->_M_use_count;
  (_Var6._M_pi)->_M_use_count = 0;
  (_Var6._M_pi)->_M_weak_count = 0;
  (_Var6._M_pi)->_vptr__Sp_counted_base = (_func_int **)0x0;
  *pp_Var4 = (_func_int *)&PTR__NotificationsHandlerImpl_00a23560;
  pp_Var4[1] = (_func_int *)pVVar3;
  a_Stack_70[0]._M_pi = p_Var2;
  p_Var5 = (_func_int *)operator_new(0x28);
  local_60._M_alloc = &__a2;
  *(undefined8 *)(p_Var5 + 8) = 0x100000001;
  *(undefined ***)p_Var5 = &PTR___Sp_counted_ptr_inplace_00a235a0;
  a_Stack_70[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined ***)(p_Var5 + 0x10) = &PTR_UpdatedBlockTip_00a235f0;
  *(_func_int ***)(p_Var5 + 0x18) = pp_Var1;
  local_48.super___shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var5 + 0x20) = p_Var2;
  local_48.super___shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_60._M_ptr = (pointer)0x0;
  pp_Var4[3] = p_Var5;
  pp_Var4[2] = p_Var5 + 0x10;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<node::(anonymous_namespace)::NotificationsProxy,_std::allocator<node::(anonymous_namespace)::NotificationsProxy>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_60);
  pVVar3 = (ValidationSignals *)pp_Var4[1];
  std::shared_ptr<CValidationInterface>::
  shared_ptr<node::(anonymous_namespace)::NotificationsProxy,void>
            (&local_48,(shared_ptr<node::(anonymous_namespace)::NotificationsProxy> *)(pp_Var4 + 2))
  ;
  callbacks.super___shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  callbacks.super___shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_48;
  ValidationSignals::RegisterSharedValidationInterface(pVVar3,callbacks);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_70);
  (this->super_Chain)._vptr_Chain = pp_Var4;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
            )(__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Handler> handleNotifications(std::shared_ptr<Notifications> notifications) override
    {
        return std::make_unique<NotificationsHandlerImpl>(validation_signals(), std::move(notifications));
    }